

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

char * get_fname(char *path,char *dest)

{
  char *pcVar1;
  size_t sVar2;
  char *__s;
  char *in_RSI;
  char *p;
  char temp [260];
  char *__dest;
  char local_128 [8];
  char *in_stack_fffffffffffffee0;
  char *local_8;
  
  if (in_RSI == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    __s = local_128;
    __dest = local_128;
    pcVar1 = point_basename(in_stack_fffffffffffffee0);
    strcpy(__dest,pcVar1);
    while( true ) {
      do {
        pcVar1 = strchr(local_128,0x2e);
        if ((pcVar1 == (char *)0x0) || (sVar2 = strlen(__s), sVar2 < 2)) goto LAB_0019411a;
      } while (*__s == '\0');
      sVar2 = strlen(__s);
      for (__s = __s + sVar2; *__s != '.'; __s = __s + -1) {
      }
      if (*__s == '\0') break;
      *__s = '\0';
    }
    __s = __s + -1;
LAB_0019411a:
    clear_path_string(__s,(size_t)__dest);
    strcpy(in_RSI,local_128);
    local_8 = in_RSI;
  }
  return local_8;
}

Assistant:

char *get_fname(const char *path, char *dest)
{
	if (dest == NULL)
	{
		return NULL;
	}
	char temp[MAX_PATH];
	char *p = temp;
	strcpy(temp, point_basename(path));
	while (strchr(temp, '.') != NULL)
	{
		if (strlen(p) < 2)
		{
			break;
		}
		if (*p)
		{
			p += strlen(p);
			while (*p != '.')
			{
				--p;
			}
			if (!*p)
			{
				--p;
				break;
			}
			else
			{
				*p = '\0';
			}
		}
	}
	clear_path_string(dest, MAX_PATH);
	strcpy(dest, temp);
	return dest;
}